

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conversion_exception.hpp
# Opt level: O2

void __thiscall
duckdb::ConversionException::ConversionException<long>
          (ConversionException *this,string *msg,long params)

{
  string local_30;
  
  Exception::ConstructMessage<long>(&local_30,msg,params);
  duckdb::ConversionException::ConversionException(this,(string *)&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  return;
}

Assistant:

explicit ConversionException(const string &msg, ARGS... params)
	    : ConversionException(ConstructMessage(msg, params...)) {
	}